

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<void_const*,(anonymous_namespace)::Data>::emplace_helper<(anonymous_namespace)::Data_const&>
          (QHash<const_void_*,_(anonymous_namespace)::Data> *this,void **key,Data *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<const_void_*,_(anonymous_namespace)::Data> *n;
  iterator<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *in_RDX;
  void **in_RSI;
  void **in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *in_stack_ffffffffffffffb8;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
  findOrInsert<void_const*>(in_stack_ffffffffffffffb8,in_RDI);
  n = QHashPrivate::iterator<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::node
                (in_RDX);
  QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>::
  createInPlace<(anonymous_namespace)::Data_const&>(n,in_RSI,(Data *)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<const_void_*,_(anonymous_namespace)::Data>::iterator::iterator(in_stack_ffffffffffffff88,it)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }